

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O1

UINT8 gb_sound_r(void *chip,UINT8 offset)

{
  byte bVar1;
  
  if (offset < 0x20) {
    if (*(char *)((long)chip + 0xdc) == '\0') {
      return gb_sound_r::read_mask[offset];
    }
    if (offset != '\x16') {
      return gb_sound_r::read_mask[offset] | *(byte *)((long)chip + (ulong)offset + 0xf0);
    }
    return *(byte *)((long)chip + 0x106) & 0x80 | *(byte *)((long)chip + 0x11) |
           *(char *)((long)chip + 0x45) * '\x02' | *(char *)((long)chip + 0x79) << 2 |
           *(char *)((long)chip + 0xad) << 3 | 0x70;
  }
  if (0x2f < offset) {
    return 0xff;
  }
  if (*(char *)((long)chip + 0x79) == '\x01') {
    if (*(char *)((long)chip + 0x130) != '\x01') {
      if (*(char *)((long)chip + 0x130) != '\0') goto LAB_0015f6c2;
      if (*(char *)((long)chip + 0xa1) != '\x01') {
        return 0xff;
      }
    }
    bVar1 = *(byte *)((long)chip + 0x9b) >> 1;
  }
  else {
LAB_0015f6c2:
    bVar1 = offset - 0x20;
  }
  return *(UINT8 *)((ulong)bVar1 + 0x110 + (long)chip);
}

Assistant:

static UINT8 gb_sound_r(void *chip, UINT8 offset)
{
	static const UINT8 read_mask[0x40] =
	{
		0x80,0x3F,0x00,0xFF,0xBF,0xFF,0x3F,0x00,0xFF,0xBF,0x7F,0xFF,0x9F,0xFF,0xBF,0xFF,
		0xFF,0x00,0x00,0xBF,0x00,0x00,0x70,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
		0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,
		0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00
	};
	gb_sound_t *gb = (gb_sound_t *)chip;

	//gb_update_state(gb, 0);

	if (offset < AUD3W0)
	{
		if (gb->snd_control.on)
		{
			if (offset == NR52)
			{
				return (gb->snd_regs[NR52]&0xf0) | (gb->snd_1.on ? 1 : 0) | (gb->snd_2.on ? 2 : 0) | (gb->snd_3.on ? 4 : 0) | (gb->snd_4.on ? 8 : 0) | 0x70;
			}
			return gb->snd_regs[offset] | read_mask[offset & 0x3F];
		}
		else
		{
			return read_mask[offset & 0x3F];
		}
	}
	else if (offset <= AUD3WF)
	{
		return gb_wave_r(gb, offset - AUD3W0);
	}
	return 0xFF;
}